

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  ulong uVar22;
  undefined8 uVar23;
  byte bVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int iVar30;
  int iVar31;
  byte bVar32;
  long lVar33;
  long lVar34;
  byte bVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined4 uVar79;
  float fVar80;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar81 [32];
  float fVar88;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar89 [32];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong *local_2878;
  undefined1 local_2840 [16];
  Geometry *local_2830;
  ulong local_2828;
  long local_2820;
  long local_2818;
  RTCFilterFunctionNArguments local_2810;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2710 [16];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  RTCHitN local_2690 [16];
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined4 local_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  uint local_2620;
  uint uStack_261c;
  uint uStack_2618;
  uint uStack_2614;
  uint uStack_2610;
  uint uStack_260c;
  uint uStack_2608;
  uint uStack_2604;
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  local_2878 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  local_2740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar110 = ZEXT3264(local_2740);
  local_2760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar111 = ZEXT3264(local_2760);
  local_2780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar112 = ZEXT3264(local_2780);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar96 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_27a0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar80 * 0.99999964)));
  auVar113 = ZEXT3264(local_27a0);
  local_27c0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar88 * 0.99999964)));
  auVar114 = ZEXT3264(local_27c0);
  local_27e0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar96 * 0.99999964)));
  auVar115 = ZEXT3264(local_27e0);
  fVar80 = fVar80 * 1.0000004;
  fVar88 = fVar88 * 1.0000004;
  fVar96 = fVar96 * 1.0000004;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar42 = uVar38 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_2600._4_4_ = iVar1;
  local_2600._0_4_ = iVar1;
  local_2600._8_4_ = iVar1;
  local_2600._12_4_ = iVar1;
  local_2600._16_4_ = iVar1;
  local_2600._20_4_ = iVar1;
  local_2600._24_4_ = iVar1;
  local_2600._28_4_ = iVar1;
  auVar103 = ZEXT3264(local_2600);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar72 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_2710 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar105 = ZEXT3264(_DAT_01fe9900);
  auVar108 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  local_25a0 = fVar80;
  fStack_259c = fVar80;
  fStack_2598 = fVar80;
  fStack_2594 = fVar80;
  fStack_2590 = fVar80;
  fStack_258c = fVar80;
  fStack_2588 = fVar80;
  fStack_2584 = fVar80;
  local_25c0 = fVar88;
  fStack_25bc = fVar88;
  fStack_25b8 = fVar88;
  fStack_25b4 = fVar88;
  fStack_25b0 = fVar88;
  fStack_25ac = fVar88;
  fStack_25a8 = fVar88;
  fStack_25a4 = fVar88;
  local_25e0 = fVar96;
  fStack_25dc = fVar96;
  fStack_25d8 = fVar96;
  fStack_25d4 = fVar96;
  fStack_25d0 = fVar96;
  fStack_25cc = fVar96;
  fStack_25c8 = fVar96;
  fStack_25c4 = fVar96;
  fVar82 = fVar80;
  fVar83 = fVar80;
  fVar84 = fVar80;
  fVar85 = fVar80;
  fVar86 = fVar80;
  fVar87 = fVar80;
  fVar90 = fVar88;
  fVar91 = fVar88;
  fVar92 = fVar88;
  fVar93 = fVar88;
  fVar94 = fVar88;
  fVar95 = fVar88;
  fVar97 = fVar96;
  fVar98 = fVar96;
  fVar99 = fVar96;
  fVar100 = fVar96;
  fVar101 = fVar96;
  fVar102 = fVar96;
  local_2828 = uVar38;
  do {
    pfVar5 = (float *)(local_2878 + -1);
    local_2878 = local_2878 + -2;
    if (*pfVar5 <= *(float *)(ray + k * 4 + 0x80)) {
      uVar43 = *local_2878;
      while ((uVar43 & 8) == 0) {
        auVar45 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar41),auVar110._0_32_);
        auVar45 = vmulps_avx512vl(auVar113._0_32_,auVar45);
        auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar38),auVar111._0_32_);
        auVar46 = vmulps_avx512vl(auVar114._0_32_,auVar46);
        auVar45 = vmaxps_avx(auVar45,auVar46);
        auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar39),auVar112._0_32_);
        auVar46 = vmulps_avx512vl(auVar115._0_32_,auVar46);
        auVar46 = vmaxps_avx(auVar46,auVar103._0_32_);
        auVar45 = vmaxps_avx(auVar45,auVar46);
        auVar47 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar43 + 0x40 + (uVar41 ^ 0x20)),
                                  auVar110._0_32_);
        auVar46._4_4_ = fVar82 * auVar47._4_4_;
        auVar46._0_4_ = fVar80 * auVar47._0_4_;
        auVar46._8_4_ = fVar83 * auVar47._8_4_;
        auVar46._12_4_ = fVar84 * auVar47._12_4_;
        auVar46._16_4_ = fVar85 * auVar47._16_4_;
        auVar46._20_4_ = fVar86 * auVar47._20_4_;
        auVar46._24_4_ = fVar87 * auVar47._24_4_;
        auVar46._28_4_ = auVar47._28_4_;
        auVar48 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar42),auVar111._0_32_);
        auVar47._4_4_ = fVar90 * auVar48._4_4_;
        auVar47._0_4_ = fVar88 * auVar48._0_4_;
        auVar47._8_4_ = fVar91 * auVar48._8_4_;
        auVar47._12_4_ = fVar92 * auVar48._12_4_;
        auVar47._16_4_ = fVar93 * auVar48._16_4_;
        auVar47._20_4_ = fVar94 * auVar48._20_4_;
        auVar47._24_4_ = fVar95 * auVar48._24_4_;
        auVar47._28_4_ = auVar48._28_4_;
        auVar46 = vminps_avx(auVar46,auVar47);
        auVar47 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar43 + 0x40 + (uVar39 ^ 0x20)),
                                  auVar112._0_32_);
        auVar48._4_4_ = fVar97 * auVar47._4_4_;
        auVar48._0_4_ = fVar96 * auVar47._0_4_;
        auVar48._8_4_ = fVar98 * auVar47._8_4_;
        auVar48._12_4_ = fVar99 * auVar47._12_4_;
        auVar48._16_4_ = fVar100 * auVar47._16_4_;
        auVar48._20_4_ = fVar101 * auVar47._20_4_;
        auVar48._24_4_ = fVar102 * auVar47._24_4_;
        auVar48._28_4_ = auVar47._28_4_;
        auVar47 = vminps_avx(auVar48,auVar72._0_32_);
        auVar46 = vminps_avx(auVar46,auVar47);
        uVar44 = vcmpps_avx512vl(auVar45,auVar46,2);
        bVar32 = (byte)uVar44;
        if (bVar32 == 0) goto LAB_007a5d7e;
        auVar46 = *(undefined1 (*) [32])(uVar43 & 0xfffffffffffffff0);
        auVar47 = ((undefined1 (*) [32])(uVar43 & 0xfffffffffffffff0))[1];
        auVar48 = vpternlogd_avx512vl(auVar105._0_32_,auVar45,auVar108._0_32_,0xf8);
        auVar49 = vpcompressd_avx512vl(auVar48);
        auVar51._0_4_ =
             (uint)(bVar32 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar48._0_4_;
        bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar12 * auVar49._4_4_ | (uint)!bVar12 * auVar48._4_4_;
        bVar12 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar12 * auVar49._8_4_ | (uint)!bVar12 * auVar48._8_4_;
        bVar12 = (bool)((byte)(uVar44 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar12 * auVar49._12_4_ | (uint)!bVar12 * auVar48._12_4_;
        bVar12 = (bool)((byte)(uVar44 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar12 * auVar49._16_4_ | (uint)!bVar12 * auVar48._16_4_;
        bVar12 = (bool)((byte)(uVar44 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar12 * auVar49._20_4_ | (uint)!bVar12 * auVar48._20_4_;
        bVar12 = (bool)((byte)(uVar44 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar12 * auVar49._24_4_ | (uint)!bVar12 * auVar48._24_4_;
        bVar12 = SUB81(uVar44 >> 7,0);
        auVar51._28_4_ = (uint)bVar12 * auVar49._28_4_ | (uint)!bVar12 * auVar48._28_4_;
        auVar48 = vpermt2q_avx512vl(auVar46,auVar51,auVar47);
        uVar43 = auVar48._0_8_;
        bVar32 = bVar32 - 1 & bVar32;
        if (bVar32 != 0) {
          auVar48 = vpshufd_avx2(auVar51,0x55);
          vpermt2q_avx512vl(auVar46,auVar48,auVar47);
          auVar49 = vpminsd_avx2(auVar51,auVar48);
          auVar48 = vpmaxsd_avx2(auVar51,auVar48);
          bVar32 = bVar32 - 1 & bVar32;
          if (bVar32 == 0) {
            auVar49 = vpermi2q_avx512vl(auVar49,auVar46,auVar47);
            uVar43 = auVar49._0_8_;
            auVar46 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
            *local_2878 = auVar46._0_8_;
            auVar45 = vpermd_avx2(auVar48,auVar45);
            *(int *)(local_2878 + 1) = auVar45._0_4_;
            local_2878 = local_2878 + 2;
          }
          else {
            auVar53 = vpshufd_avx2(auVar51,0xaa);
            vpermt2q_avx512vl(auVar46,auVar53,auVar47);
            auVar52 = vpminsd_avx2(auVar49,auVar53);
            auVar49 = vpmaxsd_avx2(auVar49,auVar53);
            auVar53 = vpminsd_avx2(auVar48,auVar49);
            auVar48 = vpmaxsd_avx2(auVar48,auVar49);
            bVar32 = bVar32 - 1 & bVar32;
            if (bVar32 == 0) {
              auVar49 = vpermi2q_avx512vl(auVar52,auVar46,auVar47);
              uVar43 = auVar49._0_8_;
              auVar49 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
              *local_2878 = auVar49._0_8_;
              auVar48 = vpermd_avx2(auVar48,auVar45);
              *(int *)(local_2878 + 1) = auVar48._0_4_;
              auVar46 = vpermt2q_avx512vl(auVar46,auVar53,auVar47);
              local_2878[2] = auVar46._0_8_;
              auVar45 = vpermd_avx2(auVar53,auVar45);
              *(int *)(local_2878 + 3) = auVar45._0_4_;
              local_2878 = local_2878 + 4;
            }
            else {
              auVar49 = vpshufd_avx2(auVar51,0xff);
              vpermt2q_avx512vl(auVar46,auVar49,auVar47);
              auVar54 = vpminsd_avx2(auVar52,auVar49);
              auVar49 = vpmaxsd_avx2(auVar52,auVar49);
              auVar52 = vpminsd_avx2(auVar53,auVar49);
              auVar49 = vpmaxsd_avx2(auVar53,auVar49);
              auVar53 = vpminsd_avx2(auVar48,auVar49);
              auVar48 = vpmaxsd_avx2(auVar48,auVar49);
              bVar32 = bVar32 - 1 & bVar32;
              if (bVar32 == 0) {
                auVar49 = vpermi2q_avx512vl(auVar54,auVar46,auVar47);
                uVar43 = auVar49._0_8_;
                auVar49 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
                *local_2878 = auVar49._0_8_;
                auVar48 = vpermd_avx2(auVar48,auVar45);
                *(int *)(local_2878 + 1) = auVar48._0_4_;
                auVar48 = vpermt2q_avx512vl(auVar46,auVar53,auVar47);
                local_2878[2] = auVar48._0_8_;
                auVar48 = vpermd_avx2(auVar53,auVar45);
                *(int *)(local_2878 + 3) = auVar48._0_4_;
                auVar46 = vpermt2q_avx512vl(auVar46,auVar52,auVar47);
                local_2878[4] = auVar46._0_8_;
                auVar45 = vpermd_avx2(auVar52,auVar45);
                *(int *)(local_2878 + 5) = auVar45._0_4_;
                local_2878 = local_2878 + 6;
              }
              else {
                auVar50 = valignd_avx512vl(auVar51,auVar51,3);
                auVar49 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar51 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar49,auVar54);
                auVar49 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar51 = vpermt2d_avx512vl(auVar51,auVar49,auVar52);
                auVar51 = vpermt2d_avx512vl(auVar51,auVar49,auVar53);
                auVar49 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar48 = vpermt2d_avx512vl(auVar51,auVar49,auVar48);
                auVar110 = ZEXT3264(auVar48);
                bVar35 = bVar32;
                do {
                  auVar49 = auVar110._0_32_;
                  auVar53._8_4_ = 1;
                  auVar53._0_8_ = 0x100000001;
                  auVar53._12_4_ = 1;
                  auVar53._16_4_ = 1;
                  auVar53._20_4_ = 1;
                  auVar53._24_4_ = 1;
                  auVar53._28_4_ = 1;
                  auVar48 = vpermd_avx2(auVar53,auVar50);
                  auVar50 = valignd_avx512vl(auVar50,auVar50,1);
                  vpermt2q_avx512vl(auVar46,auVar50,auVar47);
                  bVar35 = bVar35 - 1 & bVar35;
                  uVar23 = vpcmpd_avx512vl(auVar48,auVar49,5);
                  auVar48 = vpmaxsd_avx2(auVar48,auVar49);
                  bVar24 = (byte)uVar23 << 1;
                  auVar49 = valignd_avx512vl(auVar49,auVar49,7);
                  bVar12 = (bool)((byte)uVar23 & 1);
                  auVar52._4_4_ = (uint)bVar12 * auVar49._4_4_ | (uint)!bVar12 * auVar48._4_4_;
                  auVar52._0_4_ = auVar48._0_4_;
                  bVar12 = (bool)(bVar24 >> 2 & 1);
                  auVar52._8_4_ = (uint)bVar12 * auVar49._8_4_ | (uint)!bVar12 * auVar48._8_4_;
                  bVar12 = (bool)(bVar24 >> 3 & 1);
                  auVar52._12_4_ = (uint)bVar12 * auVar49._12_4_ | (uint)!bVar12 * auVar48._12_4_;
                  bVar12 = (bool)(bVar24 >> 4 & 1);
                  auVar52._16_4_ = (uint)bVar12 * auVar49._16_4_ | (uint)!bVar12 * auVar48._16_4_;
                  bVar12 = (bool)(bVar24 >> 5 & 1);
                  auVar52._20_4_ = (uint)bVar12 * auVar49._20_4_ | (uint)!bVar12 * auVar48._20_4_;
                  bVar12 = (bool)(bVar24 >> 6 & 1);
                  auVar52._24_4_ = (uint)bVar12 * auVar49._24_4_ | (uint)!bVar12 * auVar48._24_4_;
                  auVar52._28_4_ =
                       (uint)(bVar24 >> 7) * auVar49._28_4_ |
                       (uint)!(bool)(bVar24 >> 7) * auVar48._28_4_;
                  auVar110 = ZEXT3264(auVar52);
                } while (bVar35 != 0);
                lVar33 = (ulong)(uint)POPCOUNT((uint)bVar32) + 3;
                do {
                  auVar48 = vpermi2q_avx512vl(auVar52,auVar46,auVar47);
                  *local_2878 = auVar48._0_8_;
                  auVar49 = auVar110._0_32_;
                  auVar48 = vpermd_avx2(auVar49,auVar45);
                  *(int *)(local_2878 + 1) = auVar48._0_4_;
                  auVar52 = valignd_avx512vl(auVar49,auVar49,1);
                  local_2878 = local_2878 + 2;
                  auVar110 = ZEXT3264(auVar52);
                  lVar33 = lVar33 + -1;
                } while (lVar33 != 0);
                auVar45 = vpermt2q_avx512vl(auVar46,auVar52,auVar47);
                uVar43 = auVar45._0_8_;
              }
              auVar110 = ZEXT3264(local_2740);
              auVar111 = ZEXT3264(local_2760);
              auVar112 = ZEXT3264(local_2780);
              auVar113 = ZEXT3264(local_27a0);
              auVar114 = ZEXT3264(local_27c0);
              auVar115 = ZEXT3264(local_27e0);
              auVar103 = ZEXT3264(auVar103._0_32_);
              auVar105 = ZEXT3264(auVar105._0_32_);
              auVar108 = ZEXT3264(auVar108._0_32_);
            }
          }
        }
      }
      local_2820 = (ulong)((uint)uVar43 & 0xf) - 8;
      if (local_2820 != 0) {
        uVar43 = uVar43 & 0xfffffffffffffff0;
        local_2818 = 0;
        do {
          lVar34 = local_2818 * 0x60;
          pSVar3 = context->scene;
          ppfVar4 = (pSVar3->vertices).items;
          pfVar5 = ppfVar4[*(uint *)(uVar43 + 0x48 + lVar34)];
          auVar58._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar43 + 0x28 + lVar34));
          auVar58._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar43 + 8 + lVar34));
          pfVar6 = ppfVar4[*(uint *)(uVar43 + 0x40 + lVar34)];
          auVar59._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x20 + lVar34));
          auVar59._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + lVar34));
          pfVar7 = ppfVar4[*(uint *)(uVar43 + 0x4c + lVar34)];
          auVar61._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0x2c + lVar34));
          auVar61._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar43 + 0xc + lVar34));
          pfVar8 = ppfVar4[*(uint *)(uVar43 + 0x44 + lVar34)];
          auVar65._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x24 + lVar34));
          auVar65._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 4 + lVar34));
          lVar33 = uVar43 + 0x40 + lVar34;
          local_2580 = *(undefined8 *)(lVar33 + 0x10);
          uStack_2578 = *(undefined8 *)(lVar33 + 0x18);
          uStack_2570 = local_2580;
          uStack_2568 = uStack_2578;
          lVar33 = uVar43 + 0x50 + lVar34;
          local_26c0 = *(undefined8 *)(lVar33 + 0x10);
          uStack_26b8 = *(undefined8 *)(lVar33 + 0x18);
          auVar15 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x10 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar43 + 0x18 + lVar34)));
          auVar13 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x10 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar43 + 0x18 + lVar34)));
          auVar16 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x14 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar43 + 0x1c + lVar34)));
          auVar14 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x14 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar43 + 0x1c + lVar34)));
          auVar17 = vunpcklps_avx(auVar13,auVar14);
          auVar18 = vunpcklps_avx(auVar15,auVar16);
          auVar13 = vunpckhps_avx(auVar15,auVar16);
          auVar16 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x30 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar43 + 0x38 + lVar34)));
          auVar14 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar43 + 0x30 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar43 + 0x38 + lVar34)));
          auVar19 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x34 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar43 + 0x3c + lVar34)));
          auVar15 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar43 + 0x34 + lVar34))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar43 + 0x3c + lVar34)));
          auVar15 = vunpcklps_avx(auVar14,auVar15);
          auVar20 = vunpcklps_avx(auVar16,auVar19);
          auVar14 = vunpckhps_avx(auVar16,auVar19);
          uStack_26b0 = local_26c0;
          uStack_26a8 = uStack_26b8;
          auVar45 = vunpcklps_avx(auVar65,auVar61);
          auVar46 = vunpcklps_avx(auVar59,auVar58);
          auVar48 = vunpcklps_avx(auVar46,auVar45);
          auVar46 = vunpckhps_avx(auVar46,auVar45);
          auVar45 = vunpckhps_avx(auVar65,auVar61);
          auVar47 = vunpckhps_avx(auVar59,auVar58);
          auVar47 = vunpcklps_avx(auVar47,auVar45);
          auVar60._16_16_ = auVar18;
          auVar60._0_16_ = auVar18;
          auVar62._16_16_ = auVar13;
          auVar62._0_16_ = auVar13;
          auVar57._16_16_ = auVar17;
          auVar57._0_16_ = auVar17;
          auVar104._16_16_ = auVar20;
          auVar104._0_16_ = auVar20;
          auVar106._16_16_ = auVar14;
          auVar106._0_16_ = auVar14;
          uVar79 = *(undefined4 *)(ray + k * 4);
          auVar109._4_4_ = uVar79;
          auVar109._0_4_ = uVar79;
          auVar109._8_4_ = uVar79;
          auVar109._12_4_ = uVar79;
          auVar109._16_4_ = uVar79;
          auVar109._20_4_ = uVar79;
          auVar109._24_4_ = uVar79;
          auVar109._28_4_ = uVar79;
          auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar79 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar74._4_4_ = uVar79;
          auVar74._0_4_ = uVar79;
          auVar74._8_4_ = uVar79;
          auVar74._12_4_ = uVar79;
          auVar74._16_4_ = uVar79;
          auVar74._20_4_ = uVar79;
          auVar74._24_4_ = uVar79;
          auVar74._28_4_ = uVar79;
          auVar56._16_16_ = auVar15;
          auVar56._0_16_ = auVar15;
          uVar79 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar77._4_4_ = uVar79;
          auVar77._0_4_ = uVar79;
          auVar77._8_4_ = uVar79;
          auVar77._12_4_ = uVar79;
          auVar77._16_4_ = uVar79;
          auVar77._20_4_ = uVar79;
          auVar77._24_4_ = uVar79;
          auVar77._28_4_ = uVar79;
          fVar80 = *(float *)(ray + k * 4 + 0x60);
          auVar89._4_4_ = fVar80;
          auVar89._0_4_ = fVar80;
          auVar89._8_4_ = fVar80;
          auVar89._12_4_ = fVar80;
          auVar89._16_4_ = fVar80;
          auVar89._20_4_ = fVar80;
          auVar89._24_4_ = fVar80;
          auVar89._28_4_ = fVar80;
          auVar45 = vsubps_avx(auVar48,auVar109);
          auVar52 = vsubps_avx512vl(auVar46,auVar49);
          auVar53 = vsubps_avx512vl(auVar47,auVar51);
          auVar54 = vsubps_avx512vl(auVar60,auVar109);
          auVar50 = vsubps_avx512vl(auVar62,auVar49);
          auVar55 = vsubps_avx512vl(auVar57,auVar51);
          auVar46 = vsubps_avx(auVar104,auVar109);
          auVar49 = vsubps_avx512vl(auVar106,auVar49);
          auVar51 = vsubps_avx512vl(auVar56,auVar51);
          auVar47 = vsubps_avx(auVar46,auVar45);
          auVar48 = vsubps_avx(auVar49,auVar52);
          auVar56 = vsubps_avx512vl(auVar51,auVar53);
          auVar57 = vsubps_avx512vl(auVar45,auVar54);
          auVar58 = vsubps_avx512vl(auVar52,auVar50);
          auVar59 = vsubps_avx512vl(auVar53,auVar55);
          auVar60 = vsubps_avx512vl(auVar54,auVar46);
          auVar61 = vsubps_avx512vl(auVar50,auVar49);
          auVar62 = vsubps_avx512vl(auVar55,auVar51);
          auVar66._0_4_ = auVar46._0_4_ + auVar45._0_4_;
          auVar66._4_4_ = auVar46._4_4_ + auVar45._4_4_;
          auVar66._8_4_ = auVar46._8_4_ + auVar45._8_4_;
          auVar66._12_4_ = auVar46._12_4_ + auVar45._12_4_;
          auVar66._16_4_ = auVar46._16_4_ + auVar45._16_4_;
          auVar66._20_4_ = auVar46._20_4_ + auVar45._20_4_;
          auVar66._24_4_ = auVar46._24_4_ + auVar45._24_4_;
          auVar66._28_4_ = auVar46._28_4_ + auVar45._28_4_;
          auVar76._0_4_ = auVar49._0_4_ + auVar52._0_4_;
          auVar76._4_4_ = auVar49._4_4_ + auVar52._4_4_;
          auVar76._8_4_ = auVar49._8_4_ + auVar52._8_4_;
          auVar76._12_4_ = auVar49._12_4_ + auVar52._12_4_;
          auVar76._16_4_ = auVar49._16_4_ + auVar52._16_4_;
          auVar76._20_4_ = auVar49._20_4_ + auVar52._20_4_;
          auVar76._24_4_ = auVar49._24_4_ + auVar52._24_4_;
          auVar76._28_4_ = auVar49._28_4_ + auVar52._28_4_;
          auVar63 = vaddps_avx512vl(auVar51,auVar53);
          auVar64 = vmulps_avx512vl(auVar76,auVar56);
          auVar64 = vfmsub231ps_avx512vl(auVar64,auVar48,auVar63);
          auVar63 = vmulps_avx512vl(auVar63,auVar47);
          auVar65 = vfmsub231ps_avx512vl(auVar63,auVar56,auVar66);
          auVar63._4_4_ = auVar48._4_4_ * auVar66._4_4_;
          auVar63._0_4_ = auVar48._0_4_ * auVar66._0_4_;
          auVar63._8_4_ = auVar48._8_4_ * auVar66._8_4_;
          auVar63._12_4_ = auVar48._12_4_ * auVar66._12_4_;
          auVar63._16_4_ = auVar48._16_4_ * auVar66._16_4_;
          auVar63._20_4_ = auVar48._20_4_ * auVar66._20_4_;
          auVar63._24_4_ = auVar48._24_4_ * auVar66._24_4_;
          auVar63._28_4_ = auVar66._28_4_;
          auVar13 = vfmsub231ps_fma(auVar63,auVar47,auVar76);
          auVar73._0_4_ = fVar80 * auVar13._0_4_;
          auVar73._4_4_ = fVar80 * auVar13._4_4_;
          auVar73._8_4_ = fVar80 * auVar13._8_4_;
          auVar73._12_4_ = fVar80 * auVar13._12_4_;
          auVar73._16_4_ = fVar80 * 0.0;
          auVar73._20_4_ = fVar80 * 0.0;
          auVar73._24_4_ = fVar80 * 0.0;
          auVar73._28_4_ = 0;
          auVar63 = vfmadd231ps_avx512vl(auVar73,auVar77,auVar65);
          local_2560 = vfmadd231ps_avx512vl(auVar63,auVar74,auVar64);
          auVar63 = vaddps_avx512vl(auVar45,auVar54);
          auVar64 = vaddps_avx512vl(auVar52,auVar50);
          auVar65 = vaddps_avx512vl(auVar53,auVar55);
          auVar66 = vmulps_avx512vl(auVar64,auVar59);
          auVar66 = vfmsub231ps_avx512vl(auVar66,auVar58,auVar65);
          auVar65 = vmulps_avx512vl(auVar65,auVar57);
          auVar65 = vfmsub231ps_avx512vl(auVar65,auVar59,auVar63);
          auVar63 = vmulps_avx512vl(auVar63,auVar58);
          auVar63 = vfmsub231ps_avx512vl(auVar63,auVar57,auVar64);
          auVar64._4_4_ = fVar80 * auVar63._4_4_;
          auVar64._0_4_ = fVar80 * auVar63._0_4_;
          auVar64._8_4_ = fVar80 * auVar63._8_4_;
          auVar64._12_4_ = fVar80 * auVar63._12_4_;
          auVar64._16_4_ = fVar80 * auVar63._16_4_;
          auVar64._20_4_ = fVar80 * auVar63._20_4_;
          auVar64._24_4_ = fVar80 * auVar63._24_4_;
          auVar64._28_4_ = auVar63._28_4_;
          auVar63 = vfmadd231ps_avx512vl(auVar64,auVar77,auVar65);
          local_2540 = vfmadd231ps_avx512vl(auVar63,auVar74,auVar66);
          auVar46 = vaddps_avx512vl(auVar54,auVar46);
          auVar49 = vaddps_avx512vl(auVar50,auVar49);
          auVar51 = vaddps_avx512vl(auVar55,auVar51);
          auVar54 = vmulps_avx512vl(auVar49,auVar62);
          auVar54 = vfmsub231ps_avx512vl(auVar54,auVar61,auVar51);
          auVar51 = vmulps_avx512vl(auVar51,auVar60);
          auVar51 = vfmsub231ps_avx512vl(auVar51,auVar62,auVar46);
          auVar55._4_4_ = auVar46._4_4_ * auVar61._4_4_;
          auVar55._0_4_ = auVar46._0_4_ * auVar61._0_4_;
          auVar55._8_4_ = auVar46._8_4_ * auVar61._8_4_;
          auVar55._12_4_ = auVar46._12_4_ * auVar61._12_4_;
          auVar55._16_4_ = auVar46._16_4_ * auVar61._16_4_;
          auVar55._20_4_ = auVar46._20_4_ * auVar61._20_4_;
          auVar55._24_4_ = auVar46._24_4_ * auVar61._24_4_;
          auVar55._28_4_ = auVar46._28_4_;
          auVar13 = vfmsub231ps_fma(auVar55,auVar60,auVar49);
          auVar46 = vmulps_avx512vl(ZEXT1632(auVar13),auVar89);
          auVar46 = vfmadd231ps_avx512vl(auVar46,auVar77,auVar51);
          auVar46 = vfmadd231ps_avx512vl(auVar46,auVar74,auVar54);
          auVar107._0_4_ = local_2560._0_4_ + local_2540._0_4_;
          auVar107._4_4_ = local_2560._4_4_ + local_2540._4_4_;
          auVar107._8_4_ = local_2560._8_4_ + local_2540._8_4_;
          auVar107._12_4_ = local_2560._12_4_ + local_2540._12_4_;
          auVar107._16_4_ = local_2560._16_4_ + local_2540._16_4_;
          auVar107._20_4_ = local_2560._20_4_ + local_2540._20_4_;
          auVar107._24_4_ = local_2560._24_4_ + local_2540._24_4_;
          auVar107._28_4_ = local_2560._28_4_ + local_2540._28_4_;
          local_2520 = vaddps_avx512vl(auVar46,auVar107);
          auVar49._8_4_ = 0x7fffffff;
          auVar49._0_8_ = 0x7fffffff7fffffff;
          auVar49._12_4_ = 0x7fffffff;
          auVar49._16_4_ = 0x7fffffff;
          auVar49._20_4_ = 0x7fffffff;
          auVar49._24_4_ = 0x7fffffff;
          auVar49._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_2520,auVar49);
          auVar54._8_4_ = 0x34000000;
          auVar54._0_8_ = 0x3400000034000000;
          auVar54._12_4_ = 0x34000000;
          auVar54._16_4_ = 0x34000000;
          auVar54._20_4_ = 0x34000000;
          auVar54._24_4_ = 0x34000000;
          auVar54._28_4_ = 0x34000000;
          auVar49 = vmulps_avx512vl(local_2520,auVar54);
          auVar51 = vminps_avx512vl(local_2560,local_2540);
          auVar51 = vminps_avx512vl(auVar51,auVar46);
          auVar50._8_4_ = 0x80000000;
          auVar50._0_8_ = 0x8000000080000000;
          auVar50._12_4_ = 0x80000000;
          auVar50._16_4_ = 0x80000000;
          auVar50._20_4_ = 0x80000000;
          auVar50._24_4_ = 0x80000000;
          auVar50._28_4_ = 0x80000000;
          auVar54 = vxorps_avx512vl(auVar49,auVar50);
          uVar23 = vcmpps_avx512vl(auVar51,auVar54,5);
          auVar51 = vmaxps_avx512vl(local_2560,local_2540);
          auVar46 = vmaxps_avx512vl(auVar51,auVar46);
          uVar21 = vcmpps_avx512vl(auVar46,auVar49,2);
          bVar32 = (byte)uVar23 | (byte)uVar21;
          if (bVar32 != 0) {
            auVar46 = vmulps_avx512vl(auVar58,auVar56);
            auVar49 = vmulps_avx512vl(auVar47,auVar59);
            auVar51 = vmulps_avx512vl(auVar57,auVar48);
            auVar54 = vmulps_avx512vl(auVar61,auVar59);
            auVar50 = vmulps_avx512vl(auVar57,auVar62);
            auVar63 = vmulps_avx512vl(auVar60,auVar58);
            auVar48 = vfmsub213ps_avx512vl(auVar48,auVar59,auVar46);
            auVar64 = vfmsub213ps_avx512vl(auVar56,auVar57,auVar49);
            auVar47 = vfmsub213ps_avx512vl(auVar47,auVar58,auVar51);
            auVar55 = vfmsub213ps_avx512vl(auVar62,auVar58,auVar54);
            auVar56 = vfmsub213ps_avx512vl(auVar60,auVar59,auVar50);
            auVar57 = vfmsub213ps_avx512vl(auVar61,auVar57,auVar63);
            auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar46,auVar58);
            vandps_avx512vl(auVar54,auVar58);
            uVar38 = vcmpps_avx512vl(auVar58,auVar58,1);
            vandps_avx512vl(auVar49,auVar58);
            vandps_avx512vl(auVar50,auVar58);
            uVar44 = vcmpps_avx512vl(auVar58,auVar58,1);
            vandps_avx512vl(auVar51,auVar58);
            vandps_avx512vl(auVar63,auVar58);
            uVar22 = vcmpps_avx512vl(auVar58,auVar58,1);
            bVar12 = (bool)((byte)uVar38 & 1);
            local_2500._0_4_ = (float)((uint)bVar12 * auVar48._0_4_ | (uint)!bVar12 * auVar55._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
            local_2500._4_4_ = (float)((uint)bVar12 * auVar48._4_4_ | (uint)!bVar12 * auVar55._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
            local_2500._8_4_ = (float)((uint)bVar12 * auVar48._8_4_ | (uint)!bVar12 * auVar55._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar38 >> 3) & 1);
            local_2500._12_4_ =
                 (float)((uint)bVar12 * auVar48._12_4_ | (uint)!bVar12 * auVar55._12_4_);
            bVar12 = (bool)((byte)(uVar38 >> 4) & 1);
            local_2500._16_4_ =
                 (float)((uint)bVar12 * auVar48._16_4_ | (uint)!bVar12 * auVar55._16_4_);
            bVar12 = (bool)((byte)(uVar38 >> 5) & 1);
            local_2500._20_4_ =
                 (float)((uint)bVar12 * auVar48._20_4_ | (uint)!bVar12 * auVar55._20_4_);
            bVar12 = (bool)((byte)(uVar38 >> 6) & 1);
            local_2500._24_4_ =
                 (float)((uint)bVar12 * auVar48._24_4_ | (uint)!bVar12 * auVar55._24_4_);
            bVar12 = SUB81(uVar38 >> 7,0);
            local_2500._28_4_ = (uint)bVar12 * auVar48._28_4_ | (uint)!bVar12 * auVar55._28_4_;
            bVar12 = (bool)((byte)uVar44 & 1);
            local_24e0._0_4_ = (float)((uint)bVar12 * auVar64._0_4_ | (uint)!bVar12 * auVar56._0_4_)
            ;
            bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
            local_24e0._4_4_ = (float)((uint)bVar12 * auVar64._4_4_ | (uint)!bVar12 * auVar56._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar44 >> 2) & 1);
            local_24e0._8_4_ = (float)((uint)bVar12 * auVar64._8_4_ | (uint)!bVar12 * auVar56._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar44 >> 3) & 1);
            local_24e0._12_4_ =
                 (float)((uint)bVar12 * auVar64._12_4_ | (uint)!bVar12 * auVar56._12_4_);
            bVar12 = (bool)((byte)(uVar44 >> 4) & 1);
            local_24e0._16_4_ =
                 (float)((uint)bVar12 * auVar64._16_4_ | (uint)!bVar12 * auVar56._16_4_);
            bVar12 = (bool)((byte)(uVar44 >> 5) & 1);
            local_24e0._20_4_ =
                 (float)((uint)bVar12 * auVar64._20_4_ | (uint)!bVar12 * auVar56._20_4_);
            bVar12 = (bool)((byte)(uVar44 >> 6) & 1);
            local_24e0._24_4_ =
                 (float)((uint)bVar12 * auVar64._24_4_ | (uint)!bVar12 * auVar56._24_4_);
            bVar12 = SUB81(uVar44 >> 7,0);
            local_24e0._28_4_ = (uint)bVar12 * auVar64._28_4_ | (uint)!bVar12 * auVar56._28_4_;
            bVar12 = (bool)((byte)uVar22 & 1);
            local_24c0 = (float)((uint)bVar12 * auVar47._0_4_ | (uint)!bVar12 * auVar57._0_4_);
            bVar12 = (bool)((byte)(uVar22 >> 1) & 1);
            fStack_24bc = (float)((uint)bVar12 * auVar47._4_4_ | (uint)!bVar12 * auVar57._4_4_);
            bVar12 = (bool)((byte)(uVar22 >> 2) & 1);
            fStack_24b8 = (float)((uint)bVar12 * auVar47._8_4_ | (uint)!bVar12 * auVar57._8_4_);
            bVar12 = (bool)((byte)(uVar22 >> 3) & 1);
            fStack_24b4 = (float)((uint)bVar12 * auVar47._12_4_ | (uint)!bVar12 * auVar57._12_4_);
            bVar12 = (bool)((byte)(uVar22 >> 4) & 1);
            fStack_24b0 = (float)((uint)bVar12 * auVar47._16_4_ | (uint)!bVar12 * auVar57._16_4_);
            bVar12 = (bool)((byte)(uVar22 >> 5) & 1);
            fStack_24ac = (float)((uint)bVar12 * auVar47._20_4_ | (uint)!bVar12 * auVar57._20_4_);
            bVar12 = (bool)((byte)(uVar22 >> 6) & 1);
            fStack_24a8 = (float)((uint)bVar12 * auVar47._24_4_ | (uint)!bVar12 * auVar57._24_4_);
            bVar12 = SUB81(uVar22 >> 7,0);
            uStack_24a4 = (uint)bVar12 * auVar47._28_4_ | (uint)!bVar12 * auVar57._28_4_;
            auVar27._4_4_ = fVar80 * fStack_24bc;
            auVar27._0_4_ = fVar80 * local_24c0;
            auVar27._8_4_ = fVar80 * fStack_24b8;
            auVar27._12_4_ = fVar80 * fStack_24b4;
            auVar27._16_4_ = fVar80 * fStack_24b0;
            auVar27._20_4_ = fVar80 * fStack_24ac;
            auVar27._24_4_ = fVar80 * fStack_24a8;
            auVar27._28_4_ = fVar80;
            auVar13 = vfmadd213ps_fma(auVar77,local_24e0,auVar27);
            auVar13 = vfmadd213ps_fma(auVar74,local_2500,ZEXT1632(auVar13));
            auVar47 = ZEXT1632(CONCAT412(auVar13._12_4_ + auVar13._12_4_,
                                         CONCAT48(auVar13._8_4_ + auVar13._8_4_,
                                                  CONCAT44(auVar13._4_4_ + auVar13._4_4_,
                                                           auVar13._0_4_ + auVar13._0_4_))));
            auVar78._0_4_ = auVar53._0_4_ * local_24c0;
            auVar78._4_4_ = auVar53._4_4_ * fStack_24bc;
            auVar78._8_4_ = auVar53._8_4_ * fStack_24b8;
            auVar78._12_4_ = auVar53._12_4_ * fStack_24b4;
            auVar78._16_4_ = auVar53._16_4_ * fStack_24b0;
            auVar78._20_4_ = auVar53._20_4_ * fStack_24ac;
            auVar78._24_4_ = auVar53._24_4_ * fStack_24a8;
            auVar78._28_4_ = 0;
            auVar13 = vfmadd213ps_fma(auVar52,local_24e0,auVar78);
            auVar14 = vfmadd213ps_fma(auVar45,local_2500,ZEXT1632(auVar13));
            auVar46 = vrcp14ps_avx512vl(auVar47);
            auVar45._8_4_ = 0x3f800000;
            auVar45._0_8_ = 0x3f8000003f800000;
            auVar45._12_4_ = 0x3f800000;
            auVar45._16_4_ = 0x3f800000;
            auVar45._20_4_ = 0x3f800000;
            auVar45._24_4_ = 0x3f800000;
            auVar45._28_4_ = 0x3f800000;
            auVar45 = vfnmadd213ps_avx512vl(auVar46,auVar47,auVar45);
            auVar13 = vfmadd132ps_fma(auVar45,auVar46,auVar46);
            uVar79 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar81._4_4_ = uVar79;
            auVar81._0_4_ = uVar79;
            auVar81._8_4_ = uVar79;
            auVar81._12_4_ = uVar79;
            auVar81._16_4_ = uVar79;
            auVar81._20_4_ = uVar79;
            auVar81._24_4_ = uVar79;
            auVar81._28_4_ = uVar79;
            auVar103 = ZEXT3264(auVar81);
            local_2440 = ZEXT1632(CONCAT412(auVar13._12_4_ * (auVar14._12_4_ + auVar14._12_4_),
                                            CONCAT48(auVar13._8_4_ * (auVar14._8_4_ + auVar14._8_4_)
                                                     ,CONCAT44(auVar13._4_4_ *
                                                               (auVar14._4_4_ + auVar14._4_4_),
                                                               auVar13._0_4_ *
                                                               (auVar14._0_4_ + auVar14._0_4_)))));
            auVar72 = ZEXT3264(local_2440);
            uVar23 = vcmpps_avx512vl(local_2440,auVar81,2);
            uVar79 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar25._4_4_ = uVar79;
            auVar25._0_4_ = uVar79;
            auVar25._8_4_ = uVar79;
            auVar25._12_4_ = uVar79;
            auVar25._16_4_ = uVar79;
            auVar25._20_4_ = uVar79;
            auVar25._24_4_ = uVar79;
            auVar25._28_4_ = uVar79;
            uVar21 = vcmpps_avx512vl(local_2440,auVar25,0xd);
            bVar32 = (byte)uVar23 & (byte)uVar21 & bVar32;
            if (bVar32 != 0) {
              uVar38 = vcmpps_avx512vl(auVar47,_DAT_01faff00,4);
              uVar38 = bVar32 & uVar38;
              local_24a0 = (byte)uVar38;
              if (local_24a0 != 0) {
                local_23c0 = 0xf0;
                auVar26._8_4_ = 0x219392ef;
                auVar26._0_8_ = 0x219392ef219392ef;
                auVar26._12_4_ = 0x219392ef;
                auVar26._16_4_ = 0x219392ef;
                auVar26._20_4_ = 0x219392ef;
                auVar26._24_4_ = 0x219392ef;
                auVar26._28_4_ = 0x219392ef;
                uVar44 = vcmpps_avx512vl(local_2520,auVar26,5);
                auVar46 = vrcp14ps_avx512vl(local_2520);
                auVar75._8_4_ = 0x3f800000;
                auVar75._0_8_ = 0x3f8000003f800000;
                auVar75._12_4_ = 0x3f800000;
                auVar75._16_4_ = 0x3f800000;
                auVar75._20_4_ = 0x3f800000;
                auVar75._24_4_ = 0x3f800000;
                auVar75._28_4_ = 0x3f800000;
                auVar13 = vfnmadd213ps_fma(local_2520,auVar46,auVar75);
                auVar45 = vfmadd132ps_avx512vl(ZEXT1632(auVar13),auVar46,auVar46);
                fVar88 = (float)((uint)((byte)uVar44 & 1) * auVar45._0_4_);
                fVar80 = (float)((uint)((byte)(uVar44 >> 1) & 1) * auVar45._4_4_);
                fVar85 = (float)((uint)((byte)(uVar44 >> 2) & 1) * auVar45._8_4_);
                fVar84 = (float)((uint)((byte)(uVar44 >> 3) & 1) * auVar45._12_4_);
                fVar83 = (float)((uint)((byte)(uVar44 >> 4) & 1) * auVar45._16_4_);
                fVar82 = (float)((uint)((byte)(uVar44 >> 5) & 1) * auVar45._20_4_);
                fVar96 = (float)((uint)((byte)(uVar44 >> 6) & 1) * auVar45._24_4_);
                auVar28._4_4_ = fVar80 * local_2560._4_4_;
                auVar28._0_4_ = fVar88 * local_2560._0_4_;
                auVar28._8_4_ = fVar85 * local_2560._8_4_;
                auVar28._12_4_ = fVar84 * local_2560._12_4_;
                auVar28._16_4_ = fVar83 * local_2560._16_4_;
                auVar28._20_4_ = fVar82 * local_2560._20_4_;
                auVar28._24_4_ = fVar96 * local_2560._24_4_;
                auVar28._28_4_ = local_2560._28_4_;
                auVar45 = vminps_avx(auVar28,auVar75);
                auVar29._4_4_ = fVar80 * local_2540._4_4_;
                auVar29._0_4_ = fVar88 * local_2540._0_4_;
                auVar29._8_4_ = fVar85 * local_2540._8_4_;
                auVar29._12_4_ = fVar84 * local_2540._12_4_;
                auVar29._16_4_ = fVar83 * local_2540._16_4_;
                auVar29._20_4_ = fVar82 * local_2540._20_4_;
                auVar29._24_4_ = fVar96 * local_2540._24_4_;
                auVar29._28_4_ = auVar46._28_4_;
                auVar46 = vminps_avx(auVar29,auVar75);
                auVar47 = vsubps_avx(auVar75,auVar45);
                auVar48 = vsubps_avx(auVar75,auVar46);
                local_2460 = vblendps_avx(auVar46,auVar47,0xf0);
                local_2480 = vblendps_avx(auVar45,auVar48,0xf0);
                fVar80 = (float)DAT_01fef940;
                fVar88 = DAT_01fef940._4_4_;
                fVar96 = DAT_01fef940._8_4_;
                fVar82 = DAT_01fef940._12_4_;
                fVar83 = DAT_01fef940._16_4_;
                fVar84 = DAT_01fef940._20_4_;
                fVar85 = DAT_01fef940._24_4_;
                local_2420[0] = local_2500._0_4_ * fVar80;
                local_2420[1] = local_2500._4_4_ * fVar88;
                local_2420[2] = local_2500._8_4_ * fVar96;
                local_2420[3] = local_2500._12_4_ * fVar82;
                fStack_2410 = local_2500._16_4_ * fVar83;
                fStack_240c = local_2500._20_4_ * fVar84;
                fStack_2408 = local_2500._24_4_ * fVar85;
                uStack_2404 = local_2500._28_4_;
                local_2400[0] = local_24e0._0_4_ * fVar80;
                local_2400[1] = local_24e0._4_4_ * fVar88;
                local_2400[2] = local_24e0._8_4_ * fVar96;
                local_2400[3] = local_24e0._12_4_ * fVar82;
                fStack_23f0 = local_24e0._16_4_ * fVar83;
                fStack_23ec = local_24e0._20_4_ * fVar84;
                fStack_23e8 = local_24e0._24_4_ * fVar85;
                uStack_23e4 = local_24e0._28_4_;
                local_23e0[0] = local_24c0 * fVar80;
                local_23e0[1] = fStack_24bc * fVar88;
                local_23e0[2] = fStack_24b8 * fVar96;
                local_23e0[3] = fStack_24b4 * fVar82;
                fStack_23d0 = fStack_24b0 * fVar83;
                fStack_23cc = fStack_24ac * fVar84;
                fStack_23c8 = fStack_24a8 * fVar85;
                uStack_23c4 = uStack_24a4;
                auVar69._8_4_ = 0x7f800000;
                auVar69._0_8_ = 0x7f8000007f800000;
                auVar69._12_4_ = 0x7f800000;
                auVar69._16_4_ = 0x7f800000;
                auVar69._20_4_ = 0x7f800000;
                auVar69._24_4_ = 0x7f800000;
                auVar69._28_4_ = 0x7f800000;
                auVar45 = vblendmps_avx512vl(auVar69,local_2440);
                auVar67._0_4_ =
                     (uint)(local_24a0 & 1) * auVar45._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
                auVar67._4_4_ = (uint)bVar12 * auVar45._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
                auVar67._8_4_ = (uint)bVar12 * auVar45._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 3) & 1);
                auVar67._12_4_ = (uint)bVar12 * auVar45._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 4) & 1);
                auVar67._16_4_ = (uint)bVar12 * auVar45._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 5) & 1);
                auVar67._20_4_ = (uint)bVar12 * auVar45._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar38 >> 6) & 1);
                auVar67._24_4_ = (uint)bVar12 * auVar45._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar38 >> 7,0);
                auVar67._28_4_ = (uint)bVar12 * auVar45._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar45 = vshufps_avx(auVar67,auVar67,0xb1);
                auVar45 = vminps_avx(auVar67,auVar45);
                auVar46 = vshufpd_avx(auVar45,auVar45,5);
                auVar45 = vminps_avx(auVar45,auVar46);
                auVar46 = vpermpd_avx2(auVar45,0x4e);
                auVar45 = vminps_avx(auVar45,auVar46);
                uVar23 = vcmpps_avx512vl(auVar67,auVar45,0);
                uVar37 = (uint)uVar38;
                if (((byte)uVar23 & local_24a0) != 0) {
                  uVar37 = (uint)((byte)uVar23 & local_24a0);
                }
                uVar36 = 0;
                for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x80000000) {
                  uVar36 = uVar36 + 1;
                }
                do {
                  uVar40 = uVar36 & 0xff;
                  uVar37 = *(uint *)((long)&local_2580 + (ulong)uVar40 * 4);
                  local_2830 = (pSVar3->geometries).items[uVar37].ptr;
                  if ((local_2830->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar38 = (ulong)(byte)(~(byte)(1 << (uVar36 & 0x1f)) & (byte)uVar38);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_2830->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar38 = (ulong)(uVar40 << 2);
                      uVar79 = *(undefined4 *)(local_2480 + uVar38);
                      uVar2 = *(undefined4 *)(local_2460 + uVar38);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar38);
                      *(undefined4 *)(ray + k * 4 + 0xc0) =
                           *(undefined4 *)((long)local_2420 + uVar38);
                      *(undefined4 *)(ray + k * 4 + 0xd0) =
                           *(undefined4 *)((long)local_2400 + uVar38);
                      *(undefined4 *)(ray + k * 4 + 0xe0) =
                           *(undefined4 *)((long)local_23e0 + uVar38);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar79;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)((long)&local_26c0 + uVar38);
                      *(uint *)(ray + k * 4 + 0x120) = uVar37;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar44 = (ulong)(uVar40 * 4);
                    uVar79 = *(undefined4 *)(local_2480 + uVar44);
                    local_2660._4_4_ = uVar79;
                    local_2660._0_4_ = uVar79;
                    local_2660._8_4_ = uVar79;
                    local_2660._12_4_ = uVar79;
                    local_2650 = *(undefined4 *)(local_2460 + uVar44);
                    local_2630 = vpbroadcastd_avx512vl();
                    uVar79 = *(undefined4 *)((long)&local_26c0 + uVar44);
                    local_2640._4_4_ = uVar79;
                    local_2640._0_4_ = uVar79;
                    local_2640._8_4_ = uVar79;
                    local_2640._12_4_ = uVar79;
                    uVar79 = *(undefined4 *)((long)local_2420 + uVar44);
                    uVar2 = *(undefined4 *)((long)local_2400 + uVar44);
                    local_2680._4_4_ = uVar2;
                    local_2680._0_4_ = uVar2;
                    local_2680._8_4_ = uVar2;
                    local_2680._12_4_ = uVar2;
                    uVar2 = *(undefined4 *)((long)local_23e0 + uVar44);
                    local_2670._4_4_ = uVar2;
                    local_2670._0_4_ = uVar2;
                    local_2670._8_4_ = uVar2;
                    local_2670._12_4_ = uVar2;
                    local_2690[0] = (RTCHitN)(char)uVar79;
                    local_2690[1] = (RTCHitN)(char)((uint)uVar79 >> 8);
                    local_2690[2] = (RTCHitN)(char)((uint)uVar79 >> 0x10);
                    local_2690[3] = (RTCHitN)(char)((uint)uVar79 >> 0x18);
                    local_2690[4] = (RTCHitN)(char)uVar79;
                    local_2690[5] = (RTCHitN)(char)((uint)uVar79 >> 8);
                    local_2690[6] = (RTCHitN)(char)((uint)uVar79 >> 0x10);
                    local_2690[7] = (RTCHitN)(char)((uint)uVar79 >> 0x18);
                    local_2690[8] = (RTCHitN)(char)uVar79;
                    local_2690[9] = (RTCHitN)(char)((uint)uVar79 >> 8);
                    local_2690[10] = (RTCHitN)(char)((uint)uVar79 >> 0x10);
                    local_2690[0xb] = (RTCHitN)(char)((uint)uVar79 >> 0x18);
                    local_2690[0xc] = (RTCHitN)(char)uVar79;
                    local_2690[0xd] = (RTCHitN)(char)((uint)uVar79 >> 8);
                    local_2690[0xe] = (RTCHitN)(char)((uint)uVar79 >> 0x10);
                    local_2690[0xf] = (RTCHitN)(char)((uint)uVar79 >> 0x18);
                    uStack_264c = local_2650;
                    uStack_2648 = local_2650;
                    uStack_2644 = local_2650;
                    vpcmpeqd_avx2(ZEXT1632(local_2660),ZEXT1632(local_2660));
                    uStack_261c = context->user->instID[0];
                    local_2620 = uStack_261c;
                    uStack_2618 = uStack_261c;
                    uStack_2614 = uStack_261c;
                    uStack_2610 = context->user->instPrimID[0];
                    uStack_260c = uStack_2610;
                    uStack_2608 = uStack_2610;
                    uStack_2604 = uStack_2610;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar44);
                    local_2840 = local_2710;
                    local_2810.valid = (int *)local_2840;
                    local_2810.geometryUserPtr = local_2830->userPtr;
                    local_2810.context = context->user;
                    local_2810.hit = local_2690;
                    local_2810.N = 4;
                    local_26e0 = auVar72._0_32_;
                    local_2700 = auVar103._0_32_;
                    local_2810.ray = (RTCRayN *)ray;
                    if (local_2830->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*local_2830->intersectionFilterN)(&local_2810);
                      auVar103 = ZEXT3264(local_2700);
                      auVar72 = ZEXT3264(local_26e0);
                      auVar115 = ZEXT3264(local_27e0);
                      auVar114 = ZEXT3264(local_27c0);
                      auVar113 = ZEXT3264(local_27a0);
                      auVar112 = ZEXT3264(local_2780);
                      auVar111 = ZEXT3264(local_2760);
                      auVar110 = ZEXT3264(local_2740);
                    }
                    uVar44 = vptestmd_avx512vl(local_2840,local_2840);
                    if ((uVar44 & 0xf) == 0) {
LAB_007a5c31:
                      *(int *)(ray + k * 4 + 0x80) = auVar103._0_4_;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_2830->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_2810);
                        auVar103 = ZEXT3264(local_2700);
                        auVar72 = ZEXT3264(local_26e0);
                        auVar115 = ZEXT3264(local_27e0);
                        auVar114 = ZEXT3264(local_27c0);
                        auVar113 = ZEXT3264(local_27a0);
                        auVar112 = ZEXT3264(local_2780);
                        auVar111 = ZEXT3264(local_2760);
                        auVar110 = ZEXT3264(local_2740);
                      }
                      uVar44 = vptestmd_avx512vl(local_2840,local_2840);
                      uVar44 = uVar44 & 0xf;
                      bVar32 = (byte)uVar44;
                      if (bVar32 == 0) goto LAB_007a5c31;
                      iVar1 = *(int *)(local_2810.hit + 4);
                      iVar30 = *(int *)(local_2810.hit + 8);
                      iVar31 = *(int *)(local_2810.hit + 0xc);
                      bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar11 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xc0) =
                           (uint)(bVar32 & 1) * *(int *)local_2810.hit |
                           (uint)!(bool)(bVar32 & 1) * *(int *)(local_2810.ray + 0xc0);
                      *(uint *)(local_2810.ray + 0xc4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_2810.ray + 0xc4);
                      *(uint *)(local_2810.ray + 200) =
                           (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_2810.ray + 200);
                      *(uint *)(local_2810.ray + 0xcc) =
                           (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_2810.ray + 0xcc);
                      iVar1 = *(int *)(local_2810.hit + 0x14);
                      iVar30 = *(int *)(local_2810.hit + 0x18);
                      iVar31 = *(int *)(local_2810.hit + 0x1c);
                      bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar11 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xd0) =
                           (uint)(bVar32 & 1) * *(int *)(local_2810.hit + 0x10) |
                           (uint)!(bool)(bVar32 & 1) * *(int *)(local_2810.ray + 0xd0);
                      *(uint *)(local_2810.ray + 0xd4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_2810.ray + 0xd4);
                      *(uint *)(local_2810.ray + 0xd8) =
                           (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_2810.ray + 0xd8);
                      *(uint *)(local_2810.ray + 0xdc) =
                           (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_2810.ray + 0xdc);
                      iVar1 = *(int *)(local_2810.hit + 0x24);
                      iVar30 = *(int *)(local_2810.hit + 0x28);
                      iVar31 = *(int *)(local_2810.hit + 0x2c);
                      bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar11 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xe0) =
                           (uint)(bVar32 & 1) * *(int *)(local_2810.hit + 0x20) |
                           (uint)!(bool)(bVar32 & 1) * *(int *)(local_2810.ray + 0xe0);
                      *(uint *)(local_2810.ray + 0xe4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_2810.ray + 0xe4);
                      *(uint *)(local_2810.ray + 0xe8) =
                           (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_2810.ray + 0xe8);
                      *(uint *)(local_2810.ray + 0xec) =
                           (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_2810.ray + 0xec);
                      iVar1 = *(int *)(local_2810.hit + 0x34);
                      iVar30 = *(int *)(local_2810.hit + 0x38);
                      iVar31 = *(int *)(local_2810.hit + 0x3c);
                      bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar11 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xf0) =
                           (uint)(bVar32 & 1) * *(int *)(local_2810.hit + 0x30) |
                           (uint)!(bool)(bVar32 & 1) * *(int *)(local_2810.ray + 0xf0);
                      *(uint *)(local_2810.ray + 0xf4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_2810.ray + 0xf4);
                      *(uint *)(local_2810.ray + 0xf8) =
                           (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_2810.ray + 0xf8);
                      *(uint *)(local_2810.ray + 0xfc) =
                           (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_2810.ray + 0xfc);
                      iVar1 = *(int *)(local_2810.hit + 0x44);
                      iVar30 = *(int *)(local_2810.hit + 0x48);
                      iVar31 = *(int *)(local_2810.hit + 0x4c);
                      bVar12 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar10 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar11 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0x100) =
                           (uint)(bVar32 & 1) * *(int *)(local_2810.hit + 0x40) |
                           (uint)!(bool)(bVar32 & 1) * *(int *)(local_2810.ray + 0x100);
                      *(uint *)(local_2810.ray + 0x104) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_2810.ray + 0x104);
                      *(uint *)(local_2810.ray + 0x108) =
                           (uint)bVar10 * iVar30 | (uint)!bVar10 * *(int *)(local_2810.ray + 0x108);
                      *(uint *)(local_2810.ray + 0x10c) =
                           (uint)bVar11 * iVar31 | (uint)!bVar11 * *(int *)(local_2810.ray + 0x10c);
                      auVar13 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x50));
                      *(undefined1 (*) [16])(local_2810.ray + 0x110) = auVar13;
                      auVar13 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x60));
                      *(undefined1 (*) [16])(local_2810.ray + 0x120) = auVar13;
                      auVar13 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x70));
                      *(undefined1 (*) [16])(local_2810.ray + 0x130) = auVar13;
                      auVar13 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x80));
                      *(undefined1 (*) [16])(local_2810.ray + 0x140) = auVar13;
                      auVar103 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    uVar79 = auVar103._0_4_;
                    auVar71._4_4_ = uVar79;
                    auVar71._0_4_ = uVar79;
                    auVar71._8_4_ = uVar79;
                    auVar71._12_4_ = uVar79;
                    auVar71._16_4_ = uVar79;
                    auVar71._20_4_ = uVar79;
                    auVar71._24_4_ = uVar79;
                    auVar71._28_4_ = uVar79;
                    uVar44 = vcmpps_avx512vl(auVar72._0_32_,auVar71,2);
                    uVar38 = (byte)(~(byte)(1 << (uVar36 & 0x1f)) & (byte)uVar38) & uVar44;
                  }
                  bVar32 = (byte)uVar38;
                  if (bVar32 == 0) break;
                  auVar70._8_4_ = 0x7f800000;
                  auVar70._0_8_ = 0x7f8000007f800000;
                  auVar70._12_4_ = 0x7f800000;
                  auVar70._16_4_ = 0x7f800000;
                  auVar70._20_4_ = 0x7f800000;
                  auVar70._24_4_ = 0x7f800000;
                  auVar70._28_4_ = 0x7f800000;
                  auVar45 = vblendmps_avx512vl(auVar70,auVar72._0_32_);
                  auVar68._0_4_ =
                       (uint)(bVar32 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar32 & 1) * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
                  auVar68._4_4_ = (uint)bVar12 * auVar45._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar38 >> 2) & 1);
                  auVar68._8_4_ = (uint)bVar12 * auVar45._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar38 >> 3) & 1);
                  auVar68._12_4_ = (uint)bVar12 * auVar45._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar38 >> 4) & 1);
                  auVar68._16_4_ = (uint)bVar12 * auVar45._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar38 >> 5) & 1);
                  auVar68._20_4_ = (uint)bVar12 * auVar45._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar38 >> 6) & 1);
                  auVar68._24_4_ = (uint)bVar12 * auVar45._24_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = SUB81(uVar38 >> 7,0);
                  auVar68._28_4_ = (uint)bVar12 * auVar45._28_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar45 = vshufps_avx(auVar68,auVar68,0xb1);
                  auVar45 = vminps_avx(auVar68,auVar45);
                  auVar46 = vshufpd_avx(auVar45,auVar45,5);
                  auVar45 = vminps_avx(auVar45,auVar46);
                  auVar46 = vpermpd_avx2(auVar45,0x4e);
                  auVar45 = vminps_avx(auVar45,auVar46);
                  uVar23 = vcmpps_avx512vl(auVar68,auVar45,0);
                  bVar32 = (byte)uVar23 & bVar32;
                  uVar37 = (uint)uVar38;
                  if (bVar32 != 0) {
                    uVar37 = (uint)bVar32;
                  }
                  uVar36 = 0;
                  for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x80000000) {
                    uVar36 = uVar36 + 1;
                  }
                } while( true );
              }
            }
          }
          local_2818 = local_2818 + 1;
        } while (local_2818 != local_2820);
      }
      uVar79 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar72 = ZEXT3264(CONCAT428(uVar79,CONCAT424(uVar79,CONCAT420(uVar79,CONCAT416(uVar79,
                                                  CONCAT412(uVar79,CONCAT48(uVar79,CONCAT44(uVar79,
                                                  uVar79))))))));
      auVar103 = ZEXT3264(local_2600);
      auVar105 = ZEXT3264(_DAT_01fe9900);
      auVar108 = ZEXT3264(CONCAT428(0xfffffff8,
                                    CONCAT424(0xfffffff8,
                                              CONCAT420(0xfffffff8,
                                                        CONCAT416(0xfffffff8,
                                                                  CONCAT412(0xfffffff8,
                                                                            CONCAT48(0xfffffff8,
                                                                                                                                                                          
                                                  0xfffffff8fffffff8)))))));
      uVar38 = local_2828;
      fVar80 = local_25a0;
      fVar82 = fStack_259c;
      fVar83 = fStack_2598;
      fVar84 = fStack_2594;
      fVar85 = fStack_2590;
      fVar86 = fStack_258c;
      fVar87 = fStack_2588;
      fVar88 = local_25c0;
      fVar90 = fStack_25bc;
      fVar91 = fStack_25b8;
      fVar92 = fStack_25b4;
      fVar93 = fStack_25b0;
      fVar94 = fStack_25ac;
      fVar95 = fStack_25a8;
      fVar96 = local_25e0;
      fVar97 = fStack_25dc;
      fVar98 = fStack_25d8;
      fVar99 = fStack_25d4;
      fVar100 = fStack_25d0;
      fVar101 = fStack_25cc;
      fVar102 = fStack_25c8;
    }
LAB_007a5d7e:
    if (local_2878 == &local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }